

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O3

void __thiscall
BsplineCurve::BsplineCurve(BsplineCurve *this,vector<vec3f,_std::allocator<vec3f>_> *points)

{
  undefined8 *puVar1;
  vector<vec3f,_std::allocator<vec3f>_> local_38;
  
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(&local_38,points);
  (this->super_Curve)._vptr_Curve = (_func_int **)&PTR___cxa_pure_virtual_0016a328;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(&(this->super_Curve).controls,&local_38);
  if (local_38.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->super_Curve)._vptr_Curve = (_func_int **)&PTR_atParam_0016a2e8;
  if (3 < (ulong)(((long)(points->super__Vector_base<vec3f,_std::allocator<vec3f>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(points->super__Vector_base<vec3f,_std::allocator<vec3f>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Number of control points of BspineCurve must be more than 4!";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

BsplineCurve(const std::vector<vec3f> &points) : Curve(points) {
        if (points.size() < 4) {
            throw "Number of control points of BspineCurve must be more than 4!";
        }
    }